

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcScorr.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkTestScorr(char *pFileNameIn,char *pFileNameOut,int nStepsMax,int nBTLimit,int fNewAlgo,
                int fFlopOnly,int fFfNdOnly,int fVerbose)

{
  Io_FileType_t FileType;
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pNtk_01;
  Aig_Man_t *pAig_00;
  Gia_Man_t *pGia_00;
  Gia_Man_t *p;
  Ssw_Pars_t *pSswPars;
  Ssw_Pars_t SswPars;
  Cec_ParCor_t *pCorPars;
  Cec_ParCor_t CorPars;
  char *pFileNameInit;
  Gia_Man_t *pTempGia;
  Gia_Man_t *pGia;
  Aig_Man_t *pTempAig;
  Aig_Man_t *pAig;
  Abc_Ntk_t *pResult;
  Abc_Ntk_t *pStrash;
  Abc_Ntk_t *pLogic;
  Abc_Ntk_t *pNetlist;
  Vec_Int_t *vId2Name;
  Tst_Dat_t *pData;
  Tst_Dat_t Data;
  FILE *pFile;
  int fFlopOnly_local;
  int fNewAlgo_local;
  int nBTLimit_local;
  int nStepsMax_local;
  char *pFileNameOut_local;
  char *pFileNameIn_local;
  
  Data._48_8_ = fopen(pFileNameIn,"rb");
  if ((FILE *)Data._48_8_ == (FILE *)0x0) {
    printf("Input file \"%s\" cannot be opened.\n",pFileNameIn);
    pFileNameIn_local = (char *)0x0;
  }
  else {
    fclose((FILE *)Data._48_8_);
    Data._48_8_ = fopen(pFileNameOut,"wb");
    if ((FILE *)Data._48_8_ == (FILE *)0x0) {
      printf("Output file \"%s\" cannot be opened.\n",pFileNameOut);
      pFileNameIn_local = (char *)0x0;
    }
    else {
      fclose((FILE *)Data._48_8_);
      FileType = Io_ReadFileType(pFileNameIn);
      pNtk = Io_ReadNetlist(pFileNameIn,FileType,1);
      if (pNtk == (Abc_Ntk_t *)0x0) {
        printf("Reading input file \"%s\" has failed.\n",pFileNameIn);
        pFileNameIn_local = (char *)0x0;
      }
      else {
        pNtk_00 = Abc_NtkToLogic(pNtk);
        if (pNtk_00 == (Abc_Ntk_t *)0x0) {
          Abc_NtkDelete(pNtk);
          printf("Deriving logic network from input file %s has failed.\n",pFileNameIn);
          pFileNameIn_local = (char *)0x0;
        }
        else {
          iVar1 = Extra_FileIsType(pFileNameIn,".bench",".BENCH",(char *)0x0);
          if (iVar1 != 0) {
            CorPars.pFunc = Extra_FileNameGenericAppend(pNtk_00->pSpec,".init");
            Data._48_8_ = fopen((char *)CorPars.pFunc,"rb");
            if ((FILE *)Data._48_8_ == (FILE *)0x0) {
              printf("Init file \"%s\" cannot be opened.\n",CorPars.pFunc);
              return (Abc_Ntk_t *)0x0;
            }
            Io_ReadBenchInit(pNtk_00,(char *)CorPars.pFunc);
            Abc_NtkConvertDcLatches(pNtk_00);
            if (fVerbose != 0) {
              printf("Initial state was derived from file \"%s\".\n",CorPars.pFunc);
            }
          }
          pNtk_01 = Abc_NtkStrash(pNtk_00,0,1,0);
          if (pNtk_01 == (Abc_Ntk_t *)0x0) {
            Abc_NtkDelete(pNtk_00);
            Abc_NtkDelete(pNtk);
            printf("Deriving strashed network from input file %s has failed.\n",pFileNameIn);
            pFileNameIn_local = (char *)0x0;
          }
          else {
            pAig_00 = Abc_NtkToDar(pNtk_01,0,1);
            pData = (Tst_Dat_t *)pNtk;
            Data.vId2Name = (Vec_Int_t *)pFileNameOut;
            Data.pFileNameOut._0_4_ = fFlopOnly;
            if (fNewAlgo == 0) {
              Ssw_ManSetDefaultParams((Ssw_Pars_t *)&pSswPars);
              SswPars.fScorrGia = fVerbose;
              SswPars.fMergeFull = nBTLimit;
              SswPars.fDumpSRInit = nStepsMax;
              memset(&pData,0,0x38);
              Data.pAig = (Aig_Man_t *)0x0;
              Data.pNetlist = (Abc_Ntk_t *)pAig_00;
              pNetlist = (Abc_Ntk_t *)Abc_NtkMapGiaIntoNameId(pNtk,pAig_00,(Gia_Man_t *)0x0);
              Data.pFileNameOut._4_4_ = fFfNdOnly;
              Data.fFlopOnly = 1;
              SswPars.pData = Abc_NtkTestScorrWriteEquivAig;
              SswPars._144_8_ = &pData;
              Data.pGia = (Gia_Man_t *)pNetlist;
              pGia = (Gia_Man_t *)Ssw_SignalCorrespondence(pAig_00,(Ssw_Pars_t *)&pSswPars);
            }
            else {
              SswPars.pFunc = &pCorPars;
              Cec_ManCorSetDefaultParams((Cec_ParCor_t *)SswPars.pFunc);
              *(int *)((long)SswPars.pFunc + 0x10) = nBTLimit;
              *(int *)((long)SswPars.pFunc + 0x18) = nStepsMax;
              *(int *)((long)SswPars.pFunc + 0x40) = fVerbose;
              *(undefined4 *)((long)SswPars.pFunc + 0x2c) = 1;
              pGia_00 = Gia_ManFromAig(pAig_00);
              memset(&pData,0,0x38);
              Data.pNetlist = (Abc_Ntk_t *)0x0;
              Data.pAig = (Aig_Man_t *)pGia_00;
              pNetlist = (Abc_Ntk_t *)Abc_NtkMapGiaIntoNameId(pNtk,pAig_00,pGia_00);
              Data.pFileNameOut._4_4_ = fFfNdOnly;
              Data.fFlopOnly = 1;
              Data.pGia = (Gia_Man_t *)pNetlist;
              *(Tst_Dat_t ***)((long)SswPars.pFunc + 0x48) = &pData;
              *(code **)((long)SswPars.pFunc + 0x50) = Abc_NtkTestScorrWriteEquivGia;
              p = Cec_ManLSCorrespondence(pGia_00,(Cec_ParCor_t *)SswPars.pFunc);
              pGia = (Gia_Man_t *)Gia_ManToAigSimple(p);
              Gia_ManStop(p);
              Gia_ManStop(pGia_00);
            }
            pFileNameIn_local = (char *)Abc_NtkFromDarSeqSweep(pNtk_01,(Aig_Man_t *)pGia);
            Vec_IntFree((Vec_Int_t *)pNetlist);
            Aig_ManStop(pAig_00);
            Aig_ManStop((Aig_Man_t *)pGia);
            Abc_NtkDelete(pNtk_01);
            Abc_NtkDelete(pNtk_00);
            Abc_NtkDelete(pNtk);
          }
        }
      }
    }
  }
  return (Abc_Ntk_t *)pFileNameIn_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkTestScorr( char * pFileNameIn, char * pFileNameOut, int nStepsMax, int nBTLimit, int fNewAlgo, int fFlopOnly, int fFfNdOnly, int fVerbose )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    extern Abc_Ntk_t * Abc_NtkFromDarSeqSweep( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan );

    FILE * pFile;
    Tst_Dat_t Data, * pData = &Data;
    Vec_Int_t * vId2Name;
    Abc_Ntk_t * pNetlist, * pLogic, * pStrash, * pResult;
    Aig_Man_t * pAig, * pTempAig;
    Gia_Man_t * pGia, * pTempGia;
//    int Counter = 0;
    // check the files
    pFile = fopen( pFileNameIn, "rb" );
    if ( pFile == NULL )
    {
        printf( "Input file \"%s\" cannot be opened.\n", pFileNameIn );
        return NULL;
    }
    fclose( pFile );
    // check the files
    pFile = fopen( pFileNameOut, "wb" );
    if ( pFile == NULL )
    {
        printf( "Output file \"%s\" cannot be opened.\n", pFileNameOut );
        return NULL;
    }
    fclose( pFile );
    // derive AIG for signal correspondence
    pNetlist = Io_ReadNetlist( pFileNameIn, Io_ReadFileType(pFileNameIn), 1 );
    if ( pNetlist == NULL )
    {
        printf( "Reading input file \"%s\" has failed.\n", pFileNameIn );
        return NULL;
    }
    pLogic = Abc_NtkToLogic( pNetlist );
    if ( pLogic == NULL )
    {
        Abc_NtkDelete( pNetlist );
        printf( "Deriving logic network from input file %s has failed.\n", pFileNameIn );
        return NULL;
    }
    if ( Extra_FileIsType( pFileNameIn, ".bench", ".BENCH", NULL ) )
    {
        // get the init file name
        char * pFileNameInit = Extra_FileNameGenericAppend( pLogic->pSpec, ".init" );
        pFile = fopen( pFileNameInit, "rb" );
        if ( pFile == NULL )
        {
            printf( "Init file \"%s\" cannot be opened.\n", pFileNameInit );
            return NULL;
        }
        Io_ReadBenchInit( pLogic, pFileNameInit );
        Abc_NtkConvertDcLatches( pLogic );
        if ( fVerbose )
            printf( "Initial state was derived from file \"%s\".\n", pFileNameInit );
    }
    pStrash = Abc_NtkStrash( pLogic, 0, 1, 0 );
    if ( pStrash == NULL )
    {
        Abc_NtkDelete( pLogic );
        Abc_NtkDelete( pNetlist );
        printf( "Deriving strashed network from input file %s has failed.\n", pFileNameIn );
        return NULL;
    }
    pAig = Abc_NtkToDar( pStrash, 0, 1 ); // performs "zero" internally
    // the newer computation (&scorr)
    if ( fNewAlgo )
    {
        Cec_ParCor_t CorPars, * pCorPars = &CorPars;
        Cec_ManCorSetDefaultParams( pCorPars );
        pCorPars->nBTLimit  = nBTLimit;
        pCorPars->nStepsMax = nStepsMax;
        pCorPars->fVerbose  = fVerbose;
        pCorPars->fUseCSat  = 1;
        pGia = Gia_ManFromAig( pAig );
        // prepare the data-structure
        memset( pData, 0, sizeof(Tst_Dat_t) );
        pData->pNetlist     = pNetlist;
        pData->pAig         = NULL;
        pData->pGia         = pGia;
        pData->vId2Name     = vId2Name = Abc_NtkMapGiaIntoNameId( pNetlist, pAig, pGia );
        pData->pFileNameOut = pFileNameOut;
        pData->fFlopOnly    = fFlopOnly;
        pData->fFfNdOnly    = fFfNdOnly;
        pData->fDumpBmc     = 1;
        pCorPars->pData     = pData;
        pCorPars->pFunc     = (void *)Abc_NtkTestScorrWriteEquivGia;
        // call signal correspondence
        pTempGia = Cec_ManLSCorrespondence( pGia, pCorPars );
        pTempAig = Gia_ManToAigSimple( pTempGia );
        Gia_ManStop( pTempGia );
        Gia_ManStop( pGia );
    }
    // the older computation (scorr)
    else
    {
        Ssw_Pars_t SswPars, * pSswPars = &SswPars;
        Ssw_ManSetDefaultParams( pSswPars );
        pSswPars->nBTLimit  = nBTLimit;
        pSswPars->nStepsMax = nStepsMax;
        pSswPars->fVerbose  = fVerbose;
        // preSswPare the data-structure
        memset( pData, 0, sizeof(Tst_Dat_t) );
        pData->pNetlist     = pNetlist;
        pData->pAig         = pAig;
        pData->pGia         = NULL;
        pData->vId2Name     = vId2Name = Abc_NtkMapGiaIntoNameId( pNetlist, pAig, NULL );
        pData->pFileNameOut = pFileNameOut;
        pData->fFlopOnly    = fFlopOnly;
        pData->fFfNdOnly    = fFfNdOnly;
        pData->fDumpBmc     = 1;
        pSswPars->pData     = pData;
        pSswPars->pFunc     = (void *)Abc_NtkTestScorrWriteEquivAig;
        // call signal correspondence
        pTempAig = Ssw_SignalCorrespondence( pAig, pSswPars );
    }
    // create the resulting AIG
    pResult = Abc_NtkFromDarSeqSweep( pStrash, pTempAig );
    // cleanup
    Vec_IntFree( vId2Name );
    Aig_ManStop( pAig );
    Aig_ManStop( pTempAig );
    Abc_NtkDelete( pStrash );
    Abc_NtkDelete( pLogic );
    Abc_NtkDelete( pNetlist );
    return pResult;
}